

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmStateDirectory.cxx
# Opt level: O2

void __thiscall
cmStateDirectory::StoreProperty<cmValue>
          (cmStateDirectory *this,string *prop,cmValue value,cmListFileBacktrace *lfbt)

{
  bool bVar1;
  PointerType pBVar2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *this_00;
  BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> local_140;
  __shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
  local_110;
  __shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
  local_100;
  __shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
  local_f0;
  __shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
  local_e0;
  __shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
  local_d0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_c0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_80;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_60;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_40;
  
  bVar1 = std::operator==(prop,"INCLUDE_DIRECTORIES");
  if (bVar1) {
    if (value.Value == (string *)0x0) {
      ClearIncludeDirectories(this);
      return;
    }
    std::__cxx11::string::string((string *)&local_40,(string *)value.Value);
    std::
    __shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
    ::__shared_ptr(&local_d0,
                   (__shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
                    *)lfbt);
    BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::BT
              (&local_140,&local_40,(cmListFileBacktrace *)&local_d0);
    SetIncludeDirectories(this,&local_140);
    BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::~BT
              (&local_140);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_d0._M_refcount);
    this_00 = &local_40;
  }
  else {
    bVar1 = std::operator==(prop,"COMPILE_OPTIONS");
    if (bVar1) {
      if (value.Value == (string *)0x0) {
        ClearCompileOptions(this);
        return;
      }
      std::__cxx11::string::string((string *)&local_60,(string *)value.Value);
      std::
      __shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
      ::__shared_ptr(&local_e0,
                     (__shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
                      *)lfbt);
      BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::BT
                (&local_140,&local_60,(cmListFileBacktrace *)&local_e0);
      SetCompileOptions(this,&local_140);
      BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::~BT
                (&local_140);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_e0._M_refcount);
      this_00 = &local_60;
    }
    else {
      bVar1 = std::operator==(prop,"COMPILE_DEFINITIONS");
      if (bVar1) {
        if (value.Value == (string *)0x0) {
          ClearCompileDefinitions(this);
          return;
        }
        std::__cxx11::string::string((string *)&local_80,(string *)value.Value);
        std::
        __shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
        ::__shared_ptr(&local_f0,
                       (__shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
                        *)lfbt);
        BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::BT
                  (&local_140,&local_80,(cmListFileBacktrace *)&local_f0);
        SetCompileDefinitions(this,&local_140);
        BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::~BT
                  (&local_140);
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_f0._M_refcount);
        this_00 = &local_80;
      }
      else {
        bVar1 = std::operator==(prop,"LINK_OPTIONS");
        if (bVar1) {
          if (value.Value == (string *)0x0) {
            ClearLinkOptions(this);
            return;
          }
          std::__cxx11::string::string((string *)&local_a0,(string *)value.Value);
          std::
          __shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
          ::__shared_ptr(&local_100,
                         (__shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
                          *)lfbt);
          BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::BT
                    (&local_140,&local_a0,(cmListFileBacktrace *)&local_100);
          SetLinkOptions(this,&local_140);
          BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::~BT
                    (&local_140);
          std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_100._M_refcount);
          this_00 = &local_a0;
        }
        else {
          bVar1 = std::operator==(prop,"LINK_DIRECTORIES");
          if (!bVar1) {
            pBVar2 = cmLinkedTree<cmStateDetail::BuildsystemDirectoryStateType>::iterator::
                     operator->(&this->DirectoryState);
            cmPropertyMap::SetProperty(&pBVar2->Properties,prop,value);
            return;
          }
          if (value.Value == (string *)0x0) {
            ClearLinkDirectories(this);
            return;
          }
          std::__cxx11::string::string((string *)&local_c0,(string *)value.Value);
          std::
          __shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
          ::__shared_ptr(&local_110,
                         (__shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
                          *)lfbt);
          BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::BT
                    (&local_140,&local_c0,(cmListFileBacktrace *)&local_110);
          SetLinkDirectories(this,&local_140);
          BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::~BT
                    (&local_140);
          std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_110._M_refcount);
          this_00 = &local_c0;
        }
      }
    }
  }
  std::__cxx11::string::~string((string *)this_00);
  return;
}

Assistant:

void cmStateDirectory::StoreProperty(const std::string& prop, ValueType value,
                                     cmListFileBacktrace const& lfbt)
{
  if (prop == "INCLUDE_DIRECTORIES") {
    if (!value) {
      this->ClearIncludeDirectories();
      return;
    }
    this->SetIncludeDirectories(BT<std::string>(value, lfbt));
    return;
  }
  if (prop == "COMPILE_OPTIONS") {
    if (!value) {
      this->ClearCompileOptions();
      return;
    }
    this->SetCompileOptions(BT<std::string>(value, lfbt));
    return;
  }
  if (prop == "COMPILE_DEFINITIONS") {
    if (!value) {
      this->ClearCompileDefinitions();
      return;
    }
    this->SetCompileDefinitions(BT<std::string>(value, lfbt));
    return;
  }
  if (prop == "LINK_OPTIONS") {
    if (!value) {
      this->ClearLinkOptions();
      return;
    }
    this->SetLinkOptions(BT<std::string>(value, lfbt));
    return;
  }
  if (prop == "LINK_DIRECTORIES") {
    if (!value) {
      this->ClearLinkDirectories();
      return;
    }
    this->SetLinkDirectories(BT<std::string>(value, lfbt));
    return;
  }

  this->DirectoryState->Properties.SetProperty(prop, value);
}